

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.h
# Opt level: O1

void __thiscall BuildStatus::SlidingRateInfo::UpdateRate(SlidingRateInfo *this,int update_hint)

{
  double dVar1;
  _Map_pointer ppdVar2;
  _Elt_pointer pdVar3;
  double *pdVar4;
  uint64_t uVar5;
  long lVar6;
  _Elt_pointer pdVar7;
  _Elt_pointer pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_18;
  
  if (this->last_update_ != update_hint) {
    this->last_update_ = update_hint;
    ppdVar2 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)ppdVar2 -
                  (long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x40 == this->N) {
      std::deque<double,_std::allocator<double>_>::pop_front(&(this->times_).c);
    }
    uVar5 = Stopwatch::Now(&this->stopwatch_);
    lVar6 = uVar5 - (this->stopwatch_).started_;
    auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = 0x45300000;
    local_18 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 1e-06;
    std::deque<double,_std::allocator<double>_>::emplace_back<double>(&(this->times_).c,&local_18);
    pdVar7 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pdVar3 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    lVar6 = (long)pdVar7 - (long)pdVar3;
    pdVar8 = pdVar7;
    if (lVar6 == 0) {
      pdVar8 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pdVar4 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    dVar1 = *pdVar4;
    if ((pdVar8[-1] != dVar1) || (NAN(pdVar8[-1]) || NAN(dVar1))) {
      ppdVar2 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      lVar6 = ((long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last - (long)pdVar4 >> 3) + (lVar6 >> 3) +
              ((((ulong)((long)ppdVar2 -
                        (long)(this->times_).c.super__Deque_base<double,_std::allocator<double>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x40;
      auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10._0_8_ = lVar6;
      auVar10._12_4_ = 0x45300000;
      if (pdVar7 == pdVar3) {
        pdVar7 = ppdVar2[-1] + 0x40;
      }
      this->rate_ = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                    (pdVar7[-1] - dVar1);
    }
  }
  return;
}

Assistant:

void UpdateRate(int update_hint) {
      if (update_hint == last_update_)
        return;
      last_update_ = update_hint;

      if (times_.size() == N)
        times_.pop();
      times_.push(stopwatch_.Elapsed());
      if (times_.back() != times_.front())
        rate_ = times_.size() / (times_.back() - times_.front());
    }